

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O2

bool __thiscall Refal2::COperationsExecuter::matchLeftBeginSaveToTable_V(COperationsExecuter *this)

{
  CUnitNode *nodeA;
  bool bVar1;
  
  bVar1 = shiftLeft(this);
  if (bVar1) {
    nodeA = this->left;
    if (((nodeA->super_CUnit).type & UT_LeftParen) != 0) {
      this->left = (CUnitNode *)(nodeA->super_CUnit).field_1;
    }
    this->operation = this->operation->next;
    saveState(this);
    saveToTable(this,nodeA,this->left);
  }
  return bVar1;
}

Assistant:

inline bool COperationsExecuter::matchLeftBeginSaveToTable_V()
{
	if( shiftLeft() ) {
		CUnitNode* tmp = left;
		if( left->IsLeftParen() ) {
			left = left->PairedParen();
		}
		nextOperation();
		saveState();
		saveToTable( tmp, left );
		return true;
	} else {
		return false;
	}
}